

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::internal::DecodeRoute64
                  (Error *__return_storage_ptr__,Route64 *aRoute64,ByteArray *aBuf)

{
  pointer __n;
  pointer puVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  RouteDataEntry local_2cf;
  anon_class_1_0_00000001 local_2ca;
  v10 local_2c9;
  RouteDataEntry entry;
  v10 *pvStack_2c8;
  ulong local_2c0;
  string local_2b8;
  Error local_298;
  ByteArray local_270;
  allocator<unsigned_char> local_251;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_250;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_248;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_240;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_238;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_230;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  anon_class_1_0_00000001 local_1fa;
  v10 local_1f9;
  v10 *local_1f8;
  size_t local_1f0;
  string local_1e8;
  Error local_1c8;
  undefined1 local_1a0 [8];
  ByteArray routerIdList;
  size_t offset;
  size_t length;
  ByteArray *aBuf_local;
  Route64 *aRoute64_local;
  Error *error;
  undefined1 local_140 [16];
  v10 *local_130;
  ulong local_128;
  v10 *local_120 [2];
  string *local_110;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_108 [2];
  undefined1 local_f8 [16];
  v10 *local_e8;
  ulong local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  undefined1 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  size_t sStack_90;
  v10 **local_80;
  v10 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  Error **local_40;
  undefined1 *local_38;
  Error **local_30;
  undefined8 local_28;
  undefined1 *local_20;
  Error **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_10;
  
  Error::Error(__return_storage_ptr__);
  puVar1 = (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  __n = routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  if (puVar1 < (pointer)0x9) {
    DecodeRoute64::anon_class_1_0_00000001::operator()(&local_1fa);
    local_b8 = &local_1f8;
    local_c0 = &local_1f9;
    bVar6 = ::fmt::v10::operator()(local_c0);
    local_1f0 = bVar6.size_;
    local_1f8 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1e8;
    local_d8 = local_1f8;
    sStack_d0 = local_1f0;
    local_a0 = &local_d8;
    local_e8 = local_1f8;
    local_e0 = local_1f0;
    local_98 = local_e8;
    sStack_90 = local_e0;
    local_108[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_60 = local_f8;
    local_68 = local_108;
    local_50 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_e0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_68;
    local_58 = local_68;
    local_48 = local_60;
    local_10 = local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_1e8,local_e8,fmt,args);
    Error::Error(&local_1c8,kBadFormat,&local_1e8);
    Error::operator=(__return_storage_ptr__,&local_1c8);
    Error::~Error(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  else {
    routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 1;
    pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (aBuf,(size_type)__n);
    aRoute64->mIdSequence = *pvVar2;
    local_238._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(aBuf);
    local_230 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_238,
                            (difference_type)
                            routerIdList.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_250._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(aBuf);
    local_248 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_250,
                            (difference_type)
                            routerIdList.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_240 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_248,8);
    std::allocator<unsigned_char>::allocator(&local_251);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_228,local_230,local_240
               ,&local_251);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aRoute64->mMask,&local_228);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_228);
    std::allocator<unsigned_char>::~allocator(&local_251);
    routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + 8;
    ExtractRouterIds(&local_270,&aRoute64->mMask);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,&local_270);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_270);
    sVar3 = (long)puVar1 -
            (long)routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
    if (sVar3 == sVar4) {
      for (; routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < puVar1;
          routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               routerIdList.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        RouteDataEntry::RouteDataEntry(&local_2cf);
        pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,
                            (size_type)
                            (routerIdList.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + -9));
        local_2cf.mRouterId = *pvVar5;
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (aBuf,(size_type)
                                 routerIdList.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
        DecodeRouteDataEntry(&local_2cf,*pvVar2);
        std::
        vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>::
        emplace_back<ot::commissioner::RouteDataEntry&>
                  ((vector<ot::commissioner::RouteDataEntry,std::allocator<ot::commissioner::RouteDataEntry>>
                    *)&aRoute64->mRouteData,&local_2cf);
      }
    }
    else {
      DecodeRoute64::anon_class_1_0_00000001::operator()(&local_2ca);
      local_a8 = (undefined1 *)&stack0xfffffffffffffd38;
      local_b0 = &local_2c9;
      bVar6 = ::fmt::v10::operator()(local_b0);
      pvStack_2c8 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_110 = &local_2b8;
      local_120[0] = pvStack_2c8;
      local_80 = local_120;
      local_130 = pvStack_2c8;
      local_128 = local_2c0;
      local_78 = local_130;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_38 = local_140;
      local_40 = &error;
      local_28 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_128;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_40;
      local_30 = local_40;
      local_20 = local_38;
      local_18 = local_40;
      ::fmt::v10::vformat_abi_cxx11_(&local_2b8,local_130,fmt_00,args_00);
      Error::Error(&local_298,kBadFormat,&local_2b8);
      Error::operator=(__return_storage_ptr__,&local_298);
      Error::~Error(&local_298);
      std::__cxx11::string::~string((string *)&local_2b8);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeRoute64(Route64 &aRoute64, const ByteArray &aBuf)
{
    Error     error;
    size_t    length = aBuf.size();
    size_t    offset = 0;
    ByteArray routerIdList;

    VerifyOrExit(length >= kRouterIdMaskBytes + 1, error = ERROR_BAD_FORMAT("incorrect size of Route64"));
    aRoute64.mIdSequence = aBuf[offset++];
    aRoute64.mMask       = {aBuf.begin() + offset, aBuf.begin() + offset + kRouterIdMaskBytes};
    offset += kRouterIdMaskBytes;

    routerIdList = ExtractRouterIds(aRoute64.mMask);
    VerifyOrExit((length - offset) == routerIdList.size(), error = ERROR_BAD_FORMAT("incorrect size of RouteData"));
    while (offset < length)
    {
        RouteDataEntry entry;
        entry.mRouterId = routerIdList[offset - kRouterIdMaskBytes - 1];
        DecodeRouteDataEntry(entry, aBuf[offset]);
        aRoute64.mRouteData.emplace_back(entry);
        offset++;
    }

exit:
    return error;
}